

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O0

void av1_iadst8(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t *piVar3;
  long in_RCX;
  char in_DL;
  int32_t *in_RSI;
  int32_t *in_RDI;
  int32_t step [8];
  int32_t *bf1;
  int32_t *bf0;
  int32_t stage;
  int32_t *cospi;
  int32_t size;
  int32_t local_68;
  int32_t local_64;
  int32_t local_60;
  int32_t local_5c;
  int32_t local_58;
  undefined3 local_54;
  int8_t in_stack_ffffffffffffffaf;
  int local_4c;
  
  piVar3 = cospi_arr((int)in_DL);
  *in_RSI = in_RDI[7];
  in_RSI[1] = *in_RDI;
  in_RSI[2] = in_RDI[5];
  in_RSI[3] = in_RDI[2];
  in_RSI[4] = in_RDI[3];
  in_RSI[5] = in_RDI[4];
  in_RSI[6] = in_RDI[1];
  in_RSI[7] = in_RDI[6];
  av1_range_check_buf(1,in_RDI,in_RSI,8,*(int8_t *)(in_RCX + 1));
  half_btf(piVar3[4],*in_RSI,piVar3[0x3c],in_RSI[1],(int)in_DL);
  half_btf(piVar3[0x3c],*in_RSI,-piVar3[4],in_RSI[1],(int)in_DL);
  half_btf(piVar3[0x14],in_RSI[2],piVar3[0x2c],in_RSI[3],(int)in_DL);
  half_btf(piVar3[0x2c],in_RSI[2],-piVar3[0x14],in_RSI[3],(int)in_DL);
  half_btf(piVar3[0x24],in_RSI[4],piVar3[0x1c],in_RSI[5],(int)in_DL);
  half_btf(piVar3[0x1c],in_RSI[4],-piVar3[0x24],in_RSI[5],(int)in_DL);
  iVar1 = half_btf(piVar3[0x34],in_RSI[6],piVar3[0xc],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0xc],in_RSI[6],-piVar3[0x34],in_RSI[7],(int)in_DL);
  av1_range_check_buf(2,in_RDI,&local_68,8,*(int8_t *)(in_RCX + 2));
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  *in_RSI = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[1] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[2] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[3] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[4] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[5] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[6] = iVar2;
  iVar1 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[7] = iVar1;
  av1_range_check_buf(3,in_RDI,in_RSI,8,*(int8_t *)(in_RCX + 3));
  local_68 = *in_RSI;
  half_btf(piVar3[0x10],in_RSI[4],piVar3[0x30],in_RSI[5],(int)in_DL);
  half_btf(piVar3[0x30],in_RSI[4],-piVar3[0x10],in_RSI[5],(int)in_DL);
  iVar1 = half_btf(-piVar3[0x30],in_RSI[6],piVar3[0x10],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0x10],in_RSI[6],piVar3[0x30],in_RSI[7],(int)in_DL);
  av1_range_check_buf(4,in_RDI,&local_68,8,*(int8_t *)(in_RCX + 4));
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  *in_RSI = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[1] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[2] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[3] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[4] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[5] = iVar2;
  iVar2 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[6] = iVar2;
  iVar1 = clamp_value(iVar1,in_stack_ffffffffffffffaf);
  in_RSI[7] = iVar1;
  av1_range_check_buf(5,in_RDI,in_RSI,8,*(int8_t *)(in_RCX + 5));
  local_68 = *in_RSI;
  local_64 = in_RSI[1];
  local_60 = half_btf(piVar3[0x20],in_RSI[2],piVar3[0x20],in_RSI[3],(int)in_DL);
  local_5c = half_btf(piVar3[0x20],in_RSI[2],-piVar3[0x20],in_RSI[3],(int)in_DL);
  local_58 = in_RSI[4];
  iVar1 = half_btf(piVar3[0x20],in_RSI[6],piVar3[0x20],in_RSI[7],(int)in_DL);
  half_btf(piVar3[0x20],in_RSI[6],-piVar3[0x20],in_RSI[7],(int)in_DL);
  av1_range_check_buf(6,in_RDI,&local_68,8,*(int8_t *)(in_RCX + 6));
  *in_RSI = local_68;
  in_RSI[1] = -local_58;
  in_RSI[2] = iVar1;
  in_RSI[3] = -local_60;
  in_RSI[4] = local_5c;
  in_RSI[5] = -local_4c;
  in_RSI[6] = CONCAT13(in_stack_ffffffffffffffaf,local_54);
  in_RSI[7] = -local_64;
  return;
}

Assistant:

void av1_iadst8(const int32_t *input, int32_t *output, int8_t cos_bit,
                const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 8;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[8];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[7];
  bf1[1] = input[0];
  bf1[2] = input[5];
  bf1[3] = input[2];
  bf1[4] = input[3];
  bf1[5] = input[4];
  bf1[6] = input[1];
  bf1[7] = input[6];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[4], bf0[0], cospi[60], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[60], bf0[0], -cospi[4], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[20], bf0[2], cospi[44], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[44], bf0[2], -cospi[20], bf0[3], cos_bit);
  bf1[4] = half_btf(cospi[36], bf0[4], cospi[28], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[28], bf0[4], -cospi[36], bf0[5], cos_bit);
  bf1[6] = half_btf(cospi[52], bf0[6], cospi[12], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[12], bf0[6], -cospi[52], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[4], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[5], stage_range[stage]);
  bf1[2] = clamp_value(bf0[2] + bf0[6], stage_range[stage]);
  bf1[3] = clamp_value(bf0[3] + bf0[7], stage_range[stage]);
  bf1[4] = clamp_value(bf0[0] - bf0[4], stage_range[stage]);
  bf1[5] = clamp_value(bf0[1] - bf0[5], stage_range[stage]);
  bf1[6] = clamp_value(bf0[2] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[3] - bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 4
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = bf0[2];
  bf1[3] = bf0[3];
  bf1[4] = half_btf(cospi[16], bf0[4], cospi[48], bf0[5], cos_bit);
  bf1[5] = half_btf(cospi[48], bf0[4], -cospi[16], bf0[5], cos_bit);
  bf1[6] = half_btf(-cospi[48], bf0[6], cospi[16], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[16], bf0[6], cospi[48], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 5
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[2], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[3], stage_range[stage]);
  bf1[2] = clamp_value(bf0[0] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[1] - bf0[3], stage_range[stage]);
  bf1[4] = clamp_value(bf0[4] + bf0[6], stage_range[stage]);
  bf1[5] = clamp_value(bf0[5] + bf0[7], stage_range[stage]);
  bf1[6] = clamp_value(bf0[4] - bf0[6], stage_range[stage]);
  bf1[7] = clamp_value(bf0[5] - bf0[7], stage_range[stage]);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 6
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = bf0[0];
  bf1[1] = bf0[1];
  bf1[2] = half_btf(cospi[32], bf0[2], cospi[32], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[32], bf0[2], -cospi[32], bf0[3], cos_bit);
  bf1[4] = bf0[4];
  bf1[5] = bf0[5];
  bf1[6] = half_btf(cospi[32], bf0[6], cospi[32], bf0[7], cos_bit);
  bf1[7] = half_btf(cospi[32], bf0[6], -cospi[32], bf0[7], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 7
  bf0 = step;
  bf1 = output;
  bf1[0] = bf0[0];
  bf1[1] = -bf0[4];
  bf1[2] = bf0[6];
  bf1[3] = -bf0[2];
  bf1[4] = bf0[3];
  bf1[5] = -bf0[7];
  bf1[6] = bf0[5];
  bf1[7] = -bf0[1];
}